

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

ESPSResult
swrenderer::R_SetPatchStyle(FRenderStyle style,fixed_t alpha,int translation,uint32_t color)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  undefined4 in_EAX;
  ulong uVar5;
  FRemapTable *pFVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  code *pcVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined8 uStack_28;
  
  uStack_28 = CONCAT44(style.AsDWORD,in_EAX);
  FRenderStyle::CheckFuzz((FRenderStyle *)((long)&uStack_28 + 4));
  if (uStack_28._4_1_ == '\b') {
    uStack_28 = CONCAT44(LegacyRenderStyles[9].AsDWORD,(undefined4)uStack_28);
    uVar5 = (ulong)(LegacyRenderStyles[9].AsDWORD >> 0x18);
    alpha = 0x5555;
    color = 0;
  }
  else {
    uVar5 = uStack_28 >> 0x38;
  }
  if ((uVar5 & 1) == 0) {
    uVar11 = 0x10000;
    if ((uVar5 & 2) == 0) {
      uVar8 = 0x10000;
      if ((uint)alpha < 0x10000) {
        uVar8 = alpha;
      }
      uVar11 = 0;
      if (0 < alpha) {
        uVar11 = uVar8;
      }
    }
  }
  else {
    uVar11 = (int)(transsouls.Value * 65536.0);
  }
  if ((((translation != -1) && (drawerargs::dc_translation = (BYTE *)0x0, translation != 0)) &&
      (pFVar6 = TranslationToTable(translation), pFVar6 != (FRemapTable *)0x0)) &&
     (pFVar6->Inactive == false)) {
    drawerargs::dc_translation = pFVar6->Remap;
  }
  (anonymous_namespace)::basecolormapsave = basecolormap;
  hcolfunc_pre = R_DrawColumnHoriz;
  cVar4 = uStack_28._4_1_;
  if (uStack_28._4_1_ == '\x04') {
    colfunc = (code *)fuzzcolfunc;
    return DoDraw0;
  }
  if (uStack_28._4_4_ == LegacyRenderStyles[8].AsDWORD) {
    if (uVar11 < 0x1000) {
      return DontDraw;
    }
    colfunc = R_DrawShadedColumn;
    hcolfunc_post1 = rt_shaded1col;
    hcolfunc_post4 = rt_shaded4cols;
    lVar7 = fixedcolormap;
    if (fixedcolormap == 0) {
      lVar7 = *basecolormap;
    }
    drawerargs::dc_color = (uint)*(byte *)(lVar7 + (ulong)(color >> 0x18));
    lVar7 = (long)(0x10 - ((int)uVar11 >> 0xc));
    basecolormap = &ShadeFakeColormap + lVar7 * 4;
    drawerargs::dc_colormap = (&ShadeFakeColormap)[lVar7 * 4];
    if (-1 < (long)fixedlightlev && fixedcolormap == 0) {
      drawerargs::dc_colormap = drawerargs::dc_colormap + fixedlightlev;
    }
    goto LAB_002d011a;
  }
  if ((char)(uStack_28 >> 0x28) == '\x03') {
    uVar8 = 0x10000 - uVar11;
  }
  else {
    uVar13 = uStack_28._4_4_ >> 8 & 0xff;
    uVar8 = uVar11;
    if ((uVar13 != 2) && (uVar8 = 0, uVar13 == 1)) {
      uVar8 = 0x10000;
    }
  }
  if ((char)(uStack_28 >> 0x30) == '\x03') {
    uVar11 = 0x10000 - uVar11;
  }
  else {
    uVar13 = uStack_28._4_4_ >> 0x10 & 0xff;
    if ((uVar13 != 2) && (uVar11 = 0, uVar13 == 1)) {
      uVar11 = 0x10000;
    }
  }
  iVar12 = (int)uVar8 >> 10;
  if ((uStack_28._4_4_ >> 0x18 & 8) != 0) {
    uVar15 = color >> 0x10 & 0xff;
    uVar9 = color >> 8 & 0xff;
    uVar16 = color & 0xff;
    drawerargs::dc_color =
         (uint)RGB32k.All
               [(ulong)(uVar16 >> 3) + (ulong)(color >> 6 & 0x3e0) + (ulong)(color >> 9 & 0x7c00)];
    uVar13 = uVar16 ^ 0xff;
    uVar2 = uVar15 ^ 0xff;
    uVar3 = uVar9 ^ 0xff;
    if ((uStack_28._4_4_ >> 0x18 & 0x10) == 0) {
      uVar13 = uVar16;
      uVar2 = uVar15;
      uVar3 = uVar9;
    }
    iVar1 = (int)uVar8 >> 8;
    if (0xfe < (int)uVar8 >> 8) {
      iVar1 = 0xff;
    }
    iVar14 = 0;
    if (0 < iVar1) {
      iVar14 = iVar1;
    }
    drawerargs::dc_srccolor_bgra = uVar3 << 8 | uVar2 << 0x10 | iVar14 << 0x18 | uVar13;
    drawerargs::dc_srccolor =
         uVar3 * iVar12 >> 4 & 0xfeffbff |
         (uVar13 * iVar12 & 0xffbfe0) << 6 | (iVar12 * uVar2 & 0x3fe0) << 0x10;
    hcolfunc_pre = R_FillColumnHoriz;
    drawerargs::dc_colormap = identitycolormap;
  }
  if ((r_drawtrans.Value != true) ||
     (((((uStack_28._4_4_ >> 0x1c & 1) == 0 && (uVar8 == 0x10000)) && (uVar11 == 0)) &&
      (cVar4 == '\x01')))) {
    if ((uStack_28._4_4_ >> 0x1b & 1) == 0) {
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        hcolfunc_post1 = rt_map1col;
        colfunc = basecolfunc;
        hcolfunc_post4 = rt_map4cols;
      }
      else {
        hcolfunc_post1 = rt_tlate1col;
        colfunc = transcolfunc;
        hcolfunc_post4 = rt_tlate4cols;
      }
    }
    else {
      hcolfunc_post1 = rt_copy1col;
      colfunc = R_FillColumn;
      hcolfunc_post4 = rt_copy4cols;
    }
    goto LAB_002d011a;
  }
  drawerargs::dc_srcalpha = uVar8;
  drawerargs::dc_destalpha = uVar11;
  if ((uStack_28._4_4_ >> 0x1c & 1) == 0) {
    if ((cVar4 != '\x01') || (0x10000 < (int)(uVar11 + uVar8))) {
      drawerargs::dc_srcblend = (DWORD (*) [256])Col2RGB8_LessPrecision[iVar12];
      goto LAB_002cfeff;
    }
    drawerargs::dc_srcblend = Col2RGB8 + iVar12;
    drawerargs::dc_destblend = Col2RGB8 + ((int)uVar11 >> 10);
LAB_002cff49:
    if (uVar11 == 0x10000 && uVar8 == 0) {
      return DontDraw;
    }
    if ((int)(uVar11 + uVar8) < 0x10001) {
      if ((uStack_28._4_4_ >> 0x1b & 1) != 0) {
        hcolfunc_post1 = rt_add1col;
        colfunc = R_FillAddColumn;
        hcolfunc_post4 = rt_add4cols;
        goto LAB_002d011a;
      }
      colfunc = R_DrawTlatedAddColumn;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        colfunc = R_DrawAddColumn;
      }
      hcolfunc_post1 = rt_tlateadd1col;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        hcolfunc_post1 = rt_add1col;
      }
      pcVar10 = rt_add4cols;
      hcolfunc_post4 = rt_tlateadd4cols;
    }
    else {
      if ((uStack_28._4_4_ >> 0x1b & 1) != 0) {
        hcolfunc_post1 = rt_addclamp1col;
        colfunc = R_FillAddClampColumn;
        hcolfunc_post4 = rt_addclamp4cols;
        goto LAB_002d011a;
      }
      colfunc = R_DrawAddClampTranslatedColumn;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        colfunc = R_DrawAddClampColumn;
      }
      hcolfunc_post1 = rt_tlateaddclamp1col;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        hcolfunc_post1 = rt_addclamp1col;
      }
      pcVar10 = rt_addclamp4cols;
      hcolfunc_post4 = rt_tlateaddclamp4cols;
    }
  }
  else {
    drawerargs::dc_srcblend = Col2RGB8_Inverse + iVar12;
LAB_002cfeff:
    drawerargs::dc_destblend = (DWORD (*) [256])Col2RGB8_LessPrecision[(int)uVar11 >> 10];
    if (cVar4 == '\x03') {
      if (uVar8 == 0 && uVar11 == 0x10000) {
        return DontDraw;
      }
      if ((uStack_28._4_4_ >> 0x1b & 1) != 0) {
        hcolfunc_post1 = rt_subclamp1col;
        colfunc = R_FillRevSubClampColumn;
        hcolfunc_post4 = rt_subclamp4cols;
        goto LAB_002d011a;
      }
      colfunc = R_DrawRevSubClampTranslatedColumn;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        colfunc = R_DrawRevSubClampColumn;
      }
      hcolfunc_post1 = rt_tlaterevsubclamp1col;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        hcolfunc_post1 = rt_revsubclamp1col;
      }
      pcVar10 = rt_revsubclamp4cols;
      hcolfunc_post4 = rt_tlaterevsubclamp4cols;
    }
    else {
      if ((uStack_28._4_4_ & 0xff) != 2) {
        if ((uStack_28._4_4_ & 0xff) != 1) {
          return DontDraw;
        }
        goto LAB_002cff49;
      }
      if ((uStack_28._4_4_ >> 0x1b & 1) != 0) {
        hcolfunc_post1 = rt_subclamp1col;
        colfunc = R_FillSubClampColumn;
        hcolfunc_post4 = rt_subclamp4cols;
        goto LAB_002d011a;
      }
      colfunc = R_DrawSubClampTranslatedColumn;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        colfunc = R_DrawSubClampColumn;
      }
      hcolfunc_post1 = rt_tlatesubclamp1col;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        hcolfunc_post1 = rt_subclamp1col;
      }
      pcVar10 = rt_subclamp4cols;
      hcolfunc_post4 = rt_tlatesubclamp4cols;
    }
  }
  if (drawerargs::dc_translation == (BYTE *)0x0) {
    hcolfunc_post4 = pcVar10;
  }
LAB_002d011a:
  return DoDraw1 - (r_columnmethod.Value == 0);
}

Assistant:

ESPSResult R_SetPatchStyle(FRenderStyle style, fixed_t alpha, int translation, uint32_t color)
	{
		using namespace drawerargs;

		fixed_t fglevel, bglevel;

		style.CheckFuzz();

		if (style.BlendOp == STYLEOP_Shadow)
		{
			style = LegacyRenderStyles[STYLE_TranslucentStencil];
			alpha = TRANSLUC33;
			color = 0;
		}

		if (style.Flags & STYLEF_TransSoulsAlpha)
		{
			alpha = fixed_t(transsouls * OPAQUE);
		}
		else if (style.Flags & STYLEF_Alpha1)
		{
			alpha = FRACUNIT;
		}
		else
		{
			alpha = clamp<fixed_t>(alpha, 0, OPAQUE);
		}

		if (translation != -1)
		{
			dc_translation = NULL;
			if (translation != 0)
			{
				FRemapTable *table = TranslationToTable(translation);
				if (table != NULL && !table->Inactive)
				{
					dc_translation = table->Remap;
				}
			}
		}
		basecolormapsave = basecolormap;
		hcolfunc_pre = R_DrawColumnHoriz;

		// Check for special modes
		if (style.BlendOp == STYLEOP_Fuzz)
		{
			colfunc = fuzzcolfunc;
			return DoDraw0;
		}
		else if (style == LegacyRenderStyles[STYLE_Shaded])
		{
			// Shaded drawer only gets 16 levels of alpha because it saves memory.
			if ((alpha >>= 12) == 0)
				return DontDraw;
			colfunc = R_DrawShadedColumn;
			hcolfunc_post1 = rt_shaded1col;
			hcolfunc_post4 = rt_shaded4cols;
			dc_color = fixedcolormap ? fixedcolormap[APART(color)] : basecolormap->Maps[APART(color)];
			dc_colormap = (basecolormap = &ShadeFakeColormap[16 - alpha])->Maps;
			if (fixedlightlev >= 0 && fixedcolormap == NULL)
			{
				dc_colormap += fixedlightlev;
			}
			return r_columnmethod ? DoDraw1 : DoDraw0;
		}

		fglevel = GetAlpha(style.SrcAlpha, alpha);
		bglevel = GetAlpha(style.DestAlpha, alpha);

		if (style.Flags & STYLEF_ColorIsFixed)
		{
			uint32_t x = fglevel >> 10;
			uint32_t r = RPART(color);
			uint32_t g = GPART(color);
			uint32_t b = BPART(color);
			// dc_color is used by the rt_* routines. It is indexed into dc_srcblend.
			dc_color = RGB32k.RGB[r >> 3][g >> 3][b >> 3];
			if (style.Flags & STYLEF_InvertSource)
			{
				r = 255 - r;
				g = 255 - g;
				b = 255 - b;
			}
			uint32_t alpha = clamp(fglevel >> (FRACBITS - 8), 0, 255);
			dc_srccolor_bgra = (alpha << 24) | (r << 16) | (g << 8) | b;
			// dc_srccolor is used by the R_Fill* routines. It is premultiplied
			// with the alpha.
			dc_srccolor = ((((r*x) >> 4) << 20) | ((g*x) >> 4) | ((((b)*x) >> 4) << 10)) & 0x3feffbff;
			hcolfunc_pre = R_FillColumnHoriz;
			R_SetColorMapLight(identitycolormap.Maps, 0, 0);
		}

		if (!R_SetBlendFunc(style.BlendOp, fglevel, bglevel, style.Flags))
		{
			return DontDraw;
		}
		return r_columnmethod ? DoDraw1 : DoDraw0;
	}